

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lev_main.c
# Opt level: O0

void init_obj_classes(void)

{
  int iVar1;
  int local_14;
  int prev_class;
  int class;
  int i;
  
  local_14 = -1;
  for (prev_class = 0; prev_class < 0x21a; prev_class = prev_class + 1) {
    iVar1 = (int)objects[prev_class].oc_class;
    if (iVar1 != local_14) {
      bases[iVar1] = prev_class;
      local_14 = iVar1;
    }
  }
  return;
}

Assistant:

static void init_obj_classes(void)
{
	int i, class, prev_class;

	prev_class = -1;
	for (i = 0; i < NUM_OBJECTS; i++) {
	    class = objects[i].oc_class;
	    if (class != prev_class) {
		bases[class] = i;
		prev_class = class;
	    }
	}
}